

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O0

XmlRpcValue * __thiscall XmlRpc::XmlRpcValue::operator=(XmlRpcValue *this,XmlRpcValue *rhs)

{
  tm *ptVar1;
  XmlRpcValue *in_RSI;
  XmlRpcValue *in_RDI;
  vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *unaff_retaddr;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
  *in_stack_ffffffffffffffb0;
  XmlRpcValue *in_stack_ffffffffffffffe0;
  XmlRpcValue *__x;
  
  if (in_RDI != in_RSI) {
    __x = in_RDI;
    invalidate(in_stack_ffffffffffffffe0);
    in_RDI->_type = in_RSI->_type;
    switch(in_RDI->_type) {
    case TypeBoolean:
      (in_RDI->_value).asBool = (bool)((in_RSI->_value).asBool & 1);
      break;
    case TypeInt:
      (in_RDI->_value).asInt = (in_RSI->_value).asInt;
      break;
    case TypeDouble:
      in_RDI->_value = in_RSI->_value;
      break;
    case TypeString:
      ptVar1 = (tm *)operator_new(0x20);
      std::__cxx11::string::string((string *)ptVar1,(string *)(in_RSI->_value).asTime);
      (in_RDI->_value).asTime = ptVar1;
      break;
    case TypeDateTime:
      ptVar1 = (tm *)operator_new(0x38);
      memcpy(ptVar1,(in_RSI->_value).asTime,0x38);
      (in_RDI->_value).asTime = ptVar1;
      break;
    case TypeBase64:
      ptVar1 = (tm *)operator_new(0x18);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)unaff_retaddr,
                 (vector<char,_std::allocator<char>_> *)__x);
      (in_RDI->_value).asTime = ptVar1;
      break;
    case TypeArray:
      ptVar1 = (tm *)operator_new(0x18);
      std::vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>::vector
                (unaff_retaddr,
                 (vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *)__x);
      (in_RDI->_value).asTime = ptVar1;
      break;
    case TypeStruct:
      ptVar1 = (tm *)operator_new(0x30);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
      ::map(in_stack_ffffffffffffffb0,
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
             *)ptVar1);
      (in_RDI->_value).asTime = ptVar1;
      break;
    default:
      (in_RDI->_value).asDouble = 0.0;
    }
  }
  return in_RDI;
}

Assistant:

XmlRpcValue& XmlRpcValue::operator=(XmlRpcValue const& rhs)
  {
    if (this != &rhs)
    {
      invalidate();
      _type = rhs._type;
      switch (_type) {
        case TypeBoolean:  _value.asBool = rhs._value.asBool; break;
        case TypeInt:      _value.asInt = rhs._value.asInt; break;
        case TypeDouble:   _value.asDouble = rhs._value.asDouble; break;
        case TypeDateTime: _value.asTime = new struct tm(*rhs._value.asTime); break;
        case TypeString:   _value.asString = new std::string(*rhs._value.asString); break;
        case TypeBase64:   _value.asBinary = new BinaryData(*rhs._value.asBinary); break;
        case TypeArray:    _value.asArray = new ValueArray(*rhs._value.asArray); break;
        case TypeStruct:   _value.asStruct = new ValueStruct(*rhs._value.asStruct); break;
        default:           _value.asBinary = 0; break;
      }
    }
    return *this;
  }